

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

message * __thiscall gulps::message::print_text_abi_cxx11_(message *this)

{
  char *pcVar1;
  long in_RSI;
  message *this_local;
  string *out;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x98));
  pcVar1 = (char *)std::__cxx11::string::back();
  if (*pcVar1 != '\n') {
    std::__cxx11::string::operator+=((string *)this,'\n');
  }
  return this;
}

Assistant:

std::string print_text() const
		{
			std::string out = text;
			if(text.back() != '\n')
				out += '\n';
			return out;
		}